

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O2

DatatypeValidator * __thiscall
xercesc_4_0::DatatypeValidatorFactory::createDatatypeValidator
          (DatatypeValidatorFactory *this,XMLCh *typeName,DatatypeValidator *baseValidator,
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets,
          RefArrayVectorOf<char16_t> *enums,bool isDerivedByList,int finalSet,bool isUserDefined,
          MemoryManager *userManager)

{
  ValidatorType VVar1;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *this_00;
  int iVar2;
  ListDatatypeValidator *this_01;
  KVStringPair *pKVar3;
  undefined4 extraout_var;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this_02;
  MemoryManager *manager;
  Janitor<xercesc_4_0::RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>_>
  janFacets;
  
  if (baseValidator == (DatatypeValidator *)0x0) {
    if (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
      janFacets.fData = facets;
      Janitor<xercesc_4_0::RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>_>::
      ~Janitor(&janFacets);
    }
    if (enums != (RefArrayVectorOf<char16_t> *)0x0) {
      (*(enums->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[1])(enums);
    }
    return (DatatypeValidator *)0x0;
  }
  manager = userManager;
  if (!isUserDefined) {
    manager = XMLPlatformUtils::fgMemoryManager;
  }
  if (isDerivedByList) {
    this_01 = (ListDatatypeValidator *)XMemory::operator_new(0x98,manager);
    ListDatatypeValidator::ListDatatypeValidator
              (this_01,baseValidator,facets,enums,finalSet,manager);
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fOrdered = ORDERED_FALSE;
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fNumeric = false;
    if ((facets == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) ||
       ((pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                            (facets,SchemaSymbols::fgELT_LENGTH), pKVar3 == (KVStringPair *)0x0 &&
        ((pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                             (facets,SchemaSymbols::fgELT_MINLENGTH), pKVar3 == (KVStringPair *)0x0
         || (pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                (facets,SchemaSymbols::fgELT_MAXLENGTH),
            pKVar3 == (KVStringPair *)0x0)))))) {
      (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = false;
      (this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded = false;
    }
    else {
      (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = true;
      (this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded = true;
    }
    goto LAB_002ed846;
  }
  if (((facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) &&
      (baseValidator->fType != String)) &&
     (pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                         (facets,SchemaSymbols::fgELT_WHITESPACE), pKVar3 != (KVStringPair *)0x0)) {
    RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::removeKey
              (facets,SchemaSymbols::fgELT_WHITESPACE);
  }
  iVar2 = (*(baseValidator->super_XSerializable)._vptr_XSerializable[0xb])
                    (baseValidator,facets,enums,(ulong)(uint)finalSet,manager);
  this_01 = (ListDatatypeValidator *)CONCAT44(extraout_var,iVar2);
  (this_01->super_AbstractStringValidator).super_DatatypeValidator.fOrdered =
       baseValidator->fOrdered;
  (this_01->super_AbstractStringValidator).super_DatatypeValidator.fNumeric =
       baseValidator->fNumeric;
  if (facets == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded = false;
    if (baseValidator->fFinite != false) goto LAB_002ed807;
LAB_002ed8b8:
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = false;
  }
  else {
    this_00 = baseValidator->fFacets;
    pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                       (facets,SchemaSymbols::fgELT_MININCLUSIVE);
    if ((((pKVar3 == (KVStringPair *)0x0) &&
         (pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                             (facets,SchemaSymbols::fgELT_MINEXCLUSIVE),
         pKVar3 == (KVStringPair *)0x0)) &&
        ((this_00 == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0 ||
         ((pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                              (this_00,SchemaSymbols::fgELT_MININCLUSIVE),
          pKVar3 == (KVStringPair *)0x0 &&
          (pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                              (this_00,SchemaSymbols::fgELT_MINEXCLUSIVE),
          pKVar3 == (KVStringPair *)0x0)))))) ||
       (((pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                             (facets,SchemaSymbols::fgELT_MAXINCLUSIVE),
         pKVar3 == (KVStringPair *)0x0 &&
         (pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                             (facets,SchemaSymbols::fgELT_MAXEXCLUSIVE),
         pKVar3 == (KVStringPair *)0x0)) &&
        ((this_00 == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0 ||
         ((pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                              (this_00,SchemaSymbols::fgELT_MAXINCLUSIVE),
          pKVar3 == (KVStringPair *)0x0 &&
          (pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                              (this_00,SchemaSymbols::fgELT_MAXEXCLUSIVE),
          pKVar3 == (KVStringPair *)0x0)))))))) {
      (this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded = false;
      if (baseValidator->fFinite == false) goto LAB_002ed77a;
    }
    else {
      (this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded = true;
      if (baseValidator->fFinite != true) {
LAB_002ed77a:
        pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                           (facets,SchemaSymbols::fgELT_LENGTH);
        if ((((pKVar3 == (KVStringPair *)0x0) &&
             (pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                 (facets,SchemaSymbols::fgELT_MAXLENGTH),
             pKVar3 == (KVStringPair *)0x0)) &&
            (pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                (facets,SchemaSymbols::fgELT_TOTALDIGITS),
            pKVar3 == (KVStringPair *)0x0)) &&
           ((((this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded == false &&
             ((VVar1 = (this_01->super_AbstractStringValidator).super_DatatypeValidator.fType,
              Day < VVar1 || ((0xfa000U >> (VVar1 & (List|Double)) & 1) == 0)))) ||
            (pKVar3 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                (facets,SchemaSymbols::fgELT_FRACTIONDIGITS),
            pKVar3 == (KVStringPair *)0x0)))) goto LAB_002ed8b8;
      }
    }
LAB_002ed807:
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = true;
  }
LAB_002ed846:
  this_02 = fBuiltInRegistry;
  if ((isUserDefined) &&
     (this_02 = this->fUserDefinedRegistry,
     this->fUserDefinedRegistry ==
     (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0)) {
    this_02 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
              XMemory::operator_new(0x38,userManager);
    RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::RefHashTableOf
              (this_02,0x1d,userManager);
    this->fUserDefinedRegistry = this_02;
  }
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (this_02,typeName,(DatatypeValidator *)this_01);
  DatatypeValidator::setTypeName((DatatypeValidator *)this_01,typeName);
  return (DatatypeValidator *)this_01;
}

Assistant:

DatatypeValidator* DatatypeValidatorFactory::createDatatypeValidator
(
      const XMLCh* const                  typeName
	, DatatypeValidator* const            baseValidator
    , RefHashTableOf<KVStringPair>* const facets
    , RefArrayVectorOf<XMLCh>* const      enums
    , const bool                          isDerivedByList
    , const int                           finalSet
    , const bool                          isUserDefined
    , MemoryManager* const                userManager
)
{
	if (baseValidator == 0) {

        if (facets) {
            Janitor<KVStringPairHashTable> janFacets(facets);
        }

        if (enums) {
            Janitor<XMLChRefVector> janEnums(enums);
        }

        return 0;
    }

	DatatypeValidator* datatypeValidator = 0;
    MemoryManager* const manager = (isUserDefined)
        ? userManager : XMLPlatformUtils::fgMemoryManager;

    if (isDerivedByList) {
        datatypeValidator = new (manager) ListDatatypeValidator(baseValidator, facets, enums, finalSet, manager);

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_FALSE);
        datatypeValidator->setNumeric(false);
        if (facets &&
             ((facets->get(SchemaSymbols::fgELT_LENGTH) ||
              (facets->get(SchemaSymbols::fgELT_MINLENGTH) && facets->get(SchemaSymbols::fgELT_MAXLENGTH)))))
        {
            datatypeValidator->setBounded(true);
            datatypeValidator->setFinite(true);
        }
        else
        {
            datatypeValidator->setBounded(false);
            datatypeValidator->setFinite(false);
        }
    }
    else {

        if ((baseValidator->getType() != DatatypeValidator::String) && facets) {

            KVStringPair* value = facets->get(SchemaSymbols::fgELT_WHITESPACE);

            if (value != 0) {
                facets->removeKey(SchemaSymbols::fgELT_WHITESPACE);
            }
        }

        datatypeValidator = baseValidator->newInstance
        (
            facets
            , enums
            , finalSet
            , manager
        );

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        datatypeValidator->setOrdered(baseValidator->getOrdered());
        datatypeValidator->setNumeric(baseValidator->getNumeric());
        RefHashTableOf<KVStringPair>* baseFacets = baseValidator->getFacets();
        if (facets  &&
            ((facets->get(SchemaSymbols::fgELT_MININCLUSIVE) ||
              facets->get(SchemaSymbols::fgELT_MINEXCLUSIVE) ||
              (baseFacets && (baseFacets->get(SchemaSymbols::fgELT_MININCLUSIVE) ||
                              baseFacets->get(SchemaSymbols::fgELT_MINEXCLUSIVE))))) &&
             (facets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) ||
              facets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE) ||
              (baseFacets && ((baseFacets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) ||
                               baseFacets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE))))))
        {
            datatypeValidator->setBounded(true);
        }
        else
        {
            datatypeValidator->setBounded(false);
        }
        if (baseValidator->getFinite())
        {
            datatypeValidator->setFinite(true);
        }
        else if (!facets)
        {
            datatypeValidator->setFinite(false);
        }
        else if (facets->get(SchemaSymbols::fgELT_LENGTH) || facets->get(SchemaSymbols::fgELT_MAXLENGTH) ||
                 facets->get(SchemaSymbols::fgELT_TOTALDIGITS))
        {
            datatypeValidator->setFinite(true);
        }
        //for efficiency use this instead of rechecking...
        //else if ((facets->get(SchemaSymbols::fgELT_MININCLUSIVE) || facets->get(SchemaSymbols::fgELT_MINEXCLUSIVE)) &&
        //         (facets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) || facets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE)))
        else if (datatypeValidator->getBounded() ||
                 datatypeValidator->getType() == DatatypeValidator::Date      ||
                 datatypeValidator->getType() == DatatypeValidator::YearMonth ||
                 datatypeValidator->getType() == DatatypeValidator::Year      ||
                 datatypeValidator->getType() == DatatypeValidator::MonthDay  ||
                 datatypeValidator->getType() == DatatypeValidator::Day       ||
                 datatypeValidator->getType() == DatatypeValidator::Month)
        {
            if (facets->get(SchemaSymbols::fgELT_FRACTIONDIGITS))
            {
                datatypeValidator->setFinite(true);
            }
            else
            {
                datatypeValidator->setFinite(false);
            }
        }
        else
        {
            datatypeValidator->setFinite(false);
        }
    }

    if (datatypeValidator != 0) {

        if (isUserDefined) {

            if (!fUserDefinedRegistry) {
                fUserDefinedRegistry = new (userManager) RefHashTableOf<DatatypeValidator>(29, userManager);
            }

            fUserDefinedRegistry->put((void *)typeName, datatypeValidator);
        }
        else {
            fBuiltInRegistry->put((void *)typeName, datatypeValidator);
        }

        datatypeValidator->setTypeName(typeName);
    }

    return datatypeValidator;
}